

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O0

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::route
          (HttpRouter<uWS::HttpContextData<false>::RouterData> *this,string_view method,
          string_view url)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view url_00;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference puVar4;
  pointer this_00;
  size_t in_RCX;
  size_t extraout_RDX;
  __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
  *in_RSI;
  HttpRouter<uWS::HttpContextData<false>::RouterData> *in_RDI;
  char *in_R8;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  *p;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
  *__range2;
  HttpRouter<uWS::HttpContextData<false>::RouterData> *in_stack_00000048;
  __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
  *in_stack_ffffffffffffff80;
  
  url_00._M_str = in_R8;
  url_00._M_len = in_RCX;
  setUrl(in_RDI,url_00);
  RouteParameters::reset(&in_RDI->routeParameters);
  iVar2 = std::
          vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
          ::begin((vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                   *)in_RDI);
  iVar3 = std::
          vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
          ::end((vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                 *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return false;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
             ::operator*((__normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
                          *)&stack0xffffffffffffffb0);
    this_00 = std::
              unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ::operator->((unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                            *)0x241eee);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    __x._M_str = (char *)iVar2._M_current;
    __x._M_len = (size_t)iVar3._M_current;
    __y._M_str = (char *)puVar4;
    __y._M_len = extraout_RDX;
    in_stack_ffffffffffffff80 = in_RSI;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
    ::operator++((__normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  std::
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  ::get((unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
         *)in_stack_ffffffffffffff80);
  bVar1 = executeHandlers(in_stack_00000048,(Node *)__range2,__begin0._M_current._4_4_,
                          (RouterData *)__end0._M_current);
  return bVar1;
}

Assistant:

bool route(std::string_view method, std::string_view url) {
        /* Reset url parsing cache */
        setUrl(url);
        routeParameters.reset();

        /* Begin by finding the method node */
        for (auto &p : root.children) {
            if (p->name == method) {
                /* Then route the url */
                return executeHandlers(p.get(), 0, userData);
            }
        }

        /* We did not find any handler for this method and url */
        return false;
    }